

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::_::TransformPromiseNodeBase::getDepResult
          (TransformPromiseNodeBase *this,ExceptionOrValue *output)

{
  Exception *e;
  NullableValue<kj::Exception> _exception2498;
  NullableValue<kj::Exception> local_4d8;
  NullableValue<kj::Exception> local_340;
  
  (*(((this->dependency).ptr)->super_PromiseArenaMember)._vptr_PromiseArenaMember[3])();
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&this->dependency);
  local_4d8.isSet = false;
  NullableValue<kj::Exception>::NullableValue(&local_340,&local_4d8);
  NullableValue<kj::Exception>::~NullableValue(&local_4d8);
  if (local_340.isSet == true) {
    ExceptionOrValue::addException(output,&local_340.field_1.value);
  }
  NullableValue<kj::Exception>::~NullableValue(&local_340);
  if ((output->exception).ptr.isSet == true) {
    Exception::addTrace(&(output->exception).ptr.field_1.value,this->continuationTracePtr);
  }
  return;
}

Assistant:

void TransformPromiseNodeBase::getDepResult(ExceptionOrValue& output) {
  dependency->get(output);
  KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
    dependency = nullptr;
  })) {
    output.addException(kj::mv(exception));
  }

  KJ_IF_SOME(e, output.exception) {
    e.addTrace(continuationTracePtr);
  }
}